

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_itree_fast<float,int>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               float *row_numeric_data,double *output_depth,int *tree_num,double *tree_depth,
               size_t row)

{
  double dVar1;
  pointer pIVar2;
  size_t sVar3;
  
  pIVar2 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar3 = 0; pIVar2[sVar3].tree_left != 0;
      sVar3 = (&pIVar2[sVar3].tree_left)
              [pIVar2[sVar3].num_split < (double)row_numeric_data[pIVar2[sVar3].col_num]]) {
  }
  dVar1 = pIVar2[sVar3].score;
  *output_depth = *output_depth + dVar1;
  if (tree_num != (int *)0x0) {
    tree_num[row] = (int)sVar3;
  }
  if (tree_depth == (double *)0x0) {
    return;
  }
  *tree_depth = dVar1;
  return;
}

Assistant:

void traverse_itree_fast(std::vector<IsoTree>  &tree,
                         IsoForest             &model_outputs,
                         real_t *restrict      row_numeric_data,
                         double &restrict      output_depth,
                         sparse_ix *restrict   tree_num,
                         double *restrict      tree_depth,
                         size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    while (true)
    {
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            xval     = row_numeric_data[tree[curr_lev].col_num];
            curr_lev = (xval <= tree[curr_lev].num_split)?
                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
        }
    }
}